

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImVec2 CalcNextScrollFromScrollTargetAndClamp(ImGuiWindow *window,bool snap_on_edges)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined1 auVar5 [16];
  ImGuiContext *pIVar6;
  ImGuiContext *g;
  float fVar7;
  ImVec2 IVar8;
  undefined1 auVar9 [16];
  float fVar10;
  float fVar11;
  float fVar12;
  
  pIVar6 = GImGui;
  fVar12 = (window->Scroll).x;
  fVar11 = (window->Scroll).y;
  fVar10 = (window->ScrollTarget).x;
  if (fVar10 < 3.4028235e+38) {
    fVar2 = (window->ScrollTargetCenterRatio).x;
    if ((((!snap_on_edges) || (0.0 < fVar2)) || (fVar12 = 0.0, (window->WindowPadding).x < fVar10))
       && ((fVar12 = fVar10, snap_on_edges && (1.0 <= fVar2)))) {
      fVar7 = (window->ContentSize).x;
      fVar3 = (window->WindowPadding).x;
      if (fVar7 + fVar3 + (GImGui->Style).ItemSpacing.x <= fVar10) {
        fVar12 = fVar3 + fVar3 + fVar7;
      }
    }
    fVar12 = fVar12 - fVar2 * ((window->SizeFull).x - (window->ScrollbarSizes).x);
  }
  pfVar1 = &(window->ScrollTarget).y;
  if (*pfVar1 <= 3.4028235e+38 && *pfVar1 != 3.4028235e+38) {
    fVar10 = 0.0;
    if ((window->Flags & 1) == 0) {
      fVar10 = GImGui->FontBaseSize * window->FontWindowScale;
      if (window->ParentWindow != (ImGuiWindow *)0x0) {
        fVar10 = fVar10 * window->ParentWindow->FontWindowScale;
      }
      fVar11 = (GImGui->Style).FramePadding.y;
      fVar10 = fVar11 + fVar11 + fVar10;
    }
    fVar7 = ImGuiWindow::MenuBarHeight(window);
    fVar11 = (window->ScrollTarget).y;
    fVar2 = (window->ScrollTargetCenterRatio).y;
    if (((snap_on_edges) && (fVar2 <= 0.0)) && (fVar11 <= (window->WindowPadding).y)) {
      fVar11 = 0.0;
    }
    if ((snap_on_edges) && (1.0 <= fVar2)) {
      fVar3 = (window->ContentSize).y;
      fVar4 = (window->WindowPadding).y;
      if (fVar3 + fVar4 + (pIVar6->Style).ItemSpacing.y <= fVar11) {
        fVar11 = fVar4 + fVar4 + fVar3;
      }
    }
    fVar11 = fVar11 - fVar2 * (((window->SizeFull).y - (window->ScrollbarSizes).y) -
                              (fVar10 + fVar7));
  }
  IVar8.x = (float)(-(uint)(0.0 <= fVar12) & (uint)fVar12);
  IVar8.y = (float)(-(uint)(0.0 <= fVar11) & (uint)fVar11);
  auVar9._8_8_ = 0;
  auVar9._0_4_ = IVar8.x;
  auVar9._4_4_ = IVar8.y;
  if ((window->Collapsed == false) && (window->SkipItems == false)) {
    auVar5._8_8_ = 0;
    auVar5._0_4_ = (window->ScrollMax).x;
    auVar5._4_4_ = (window->ScrollMax).y;
    auVar9 = minps(auVar9,auVar5);
    IVar8 = auVar9._0_8_;
  }
  return IVar8;
}

Assistant:

static ImVec2 CalcNextScrollFromScrollTargetAndClamp(ImGuiWindow* window, bool snap_on_edges)
{
    ImGuiContext& g = *GImGui;
    ImVec2 scroll = window->Scroll;
    if (window->ScrollTarget.x < FLT_MAX)
    {
        float cr_x = window->ScrollTargetCenterRatio.x;
        float target_x = window->ScrollTarget.x;
        if (snap_on_edges && cr_x <= 0.0f && target_x <= window->WindowPadding.x)
            target_x = 0.0f;
        else if (snap_on_edges && cr_x >= 1.0f && target_x >= window->ContentSize.x + window->WindowPadding.x + g.Style.ItemSpacing.x)
            target_x = window->ContentSize.x + window->WindowPadding.x * 2.0f;
        scroll.x = target_x - cr_x * (window->SizeFull.x - window->ScrollbarSizes.x);
    }
    if (window->ScrollTarget.y < FLT_MAX)
    {
        // 'snap_on_edges' allows for a discontinuity at the edge of scrolling limits to take account of WindowPadding so that scrolling to make the last item visible scroll far enough to see the padding.
        float decoration_up_height = window->TitleBarHeight() + window->MenuBarHeight();
        float cr_y = window->ScrollTargetCenterRatio.y;
        float target_y = window->ScrollTarget.y;
        if (snap_on_edges && cr_y <= 0.0f && target_y <= window->WindowPadding.y)
            target_y = 0.0f;
        if (snap_on_edges && cr_y >= 1.0f && target_y >= window->ContentSize.y + window->WindowPadding.y + g.Style.ItemSpacing.y)
            target_y = window->ContentSize.y + window->WindowPadding.y * 2.0f;
        scroll.y = target_y - cr_y * (window->SizeFull.y - window->ScrollbarSizes.y - decoration_up_height);
    }
    scroll = ImMax(scroll, ImVec2(0.0f, 0.0f));
    if (!window->Collapsed && !window->SkipItems)
    {
        scroll.x = ImMin(scroll.x, window->ScrollMax.x);
        scroll.y = ImMin(scroll.y, window->ScrollMax.y);
    }
    return scroll;
}